

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  int iVar1;
  uint local_20;
  OpCode local_1c;
  ravi_type_map result_type;
  OpCode op;
  expdesc *e_local;
  FuncState *fs_local;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(fs,"luaK_dischargevars (VLOCAL->VNONRELOC) %e\n",e);
    }
    break;
  case VUPVAL:
    iVar1 = luaK_codeABC(fs,OP_GETUPVAL,0,(e->u).info,0);
    (e->u).info = iVar1;
    e->k = VRELOCABLE;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(fs,"luaK_dischargevars (VUPVAL->VRELOCABLE) %e\n",e);
    }
    break;
  case VINDEXED:
    freereg(fs,(int)(e->u).ind.idx);
    if ((e->u).ind.vt == '\b') {
      freereg(fs,(uint)(e->u).ind.t);
      if ((e->u).ind.key_ravi_type_map == 8) {
        if (e->ravi_type_map == 0x40) {
          local_1c = OP_RAVI_FARRAY_GET;
        }
        else if (e->ravi_type_map == 0x20) {
          local_1c = OP_RAVI_IARRAY_GET;
        }
        else {
          local_1c = OP_RAVI_GETI;
        }
      }
      else if (((e->u).ind.key_ravi_type_map == 0x100) &&
              (iVar1 = isshortstr(fs,(int)(e->u).ind.idx), iVar1 != 0)) {
        local_1c = OP_RAVI_GETFIELD;
        if (e->ravi_type_map == 0x80) {
          local_1c = OP_RAVI_TABLE_GETFIELD;
        }
      }
      else {
        local_1c = OP_GETTABLE;
      }
    }
    else {
      if ((e->u).ind.vt != '\t') {
        __assert_fail("e->u.ind.vt == VUPVAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x26a,"void luaK_dischargevars(FuncState *, expdesc *)");
      }
      if (((e->u).ind.key_ravi_type_map == 0x100) &&
         (iVar1 = isshortstr(fs,(int)(e->u).ind.idx), iVar1 != 0)) {
        local_1c = OP_RAVI_GETTABUP_SK;
      }
      else {
        local_1c = OP_GETTABUP;
      }
    }
    local_20 = 0;
    if ((e->ravi_type_map & 0xffffff9f) == 0) {
      if ((e->ravi_type_map & 0x20) != 0) {
        local_20 = 8;
      }
      if ((e->ravi_type_map & 0x40) != 0) {
        local_20 = local_20 | 0x10;
      }
    }
    else {
      local_20 = 0xffffffff;
    }
    e->ravi_type_map = local_20;
    iVar1 = luaK_codeABC(fs,local_1c,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    (e->u).info = iVar1;
    e->k = VRELOCABLE;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(fs,"luaK_dischargevars (VINDEXED->VRELOCABLE) %e\n",e);
    }
    break;
  default:
    break;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
  }
  return;
}

Assistant:

void luaK_dischargevars (FuncState *fs, expdesc *e) {
  switch (e->k) {
    case VLOCAL: {  /* already in a register */
      e->k = VNONRELOC;  /* becomes a non-relocatable value */
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VLOCAL->VNONRELOC) %e\n", e));
      break;
    }
    case VUPVAL: {  /* move value to some (pending) register */
      e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
      e->k = VRELOCABLE;
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VUPVAL->VRELOCABLE) %e\n", e));
      break;
    }
    case VINDEXED: {
      OpCode op;
      freereg(fs, e->u.ind.idx);
      if (e->u.ind.vt == VLOCAL) {  /* is 't' in a register? */
        freereg(fs, e->u.ind.t);
        /* TODO we should do this for upvalues too */
        /* table access - set specialized op codes if array types are detected */
        if (e->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (e->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
            op = OP_RAVI_FARRAY_GET;
          } else if (e->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
            op = OP_RAVI_IARRAY_GET;
          } else {
            op = OP_RAVI_GETI;
          }
        } else if (e->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, e->u.ind.idx)) {
          op = e->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_GETFIELD : OP_RAVI_GETFIELD;
        } else {
          op = OP_GETTABLE;
        }
      }
      else {
        lua_assert(e->u.ind.vt == VUPVAL);
        if (e->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, e->u.ind.idx))
          op = OP_RAVI_GETTABUP_SK;
        else
          op = OP_GETTABUP;  /* 't' is in an upvalue */
      }
      ravi_type_map result_type = 0;
      if (e->ravi_type_map & (~(RAVI_TM_INTEGER_ARRAY | RAVI_TM_FLOAT_ARRAY))) {
        result_type = RAVI_TM_ANY;
      } else {
        if (e->ravi_type_map & RAVI_TM_INTEGER_ARRAY) result_type |= RAVI_TM_INTEGER;
        if (e->ravi_type_map & RAVI_TM_FLOAT_ARRAY) result_type |= RAVI_TM_FLOAT;
      }
      e->ravi_type_map = result_type;
      e->u.info = luaK_codeABC(fs, op, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOCABLE;
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VINDEXED->VRELOCABLE) %e\n", e));
      break;
    }
    case VVARARG: case VCALL: {
      luaK_setoneret(fs, e);
      break;
    }
    default: break;  /* there is one value available (somewhere) */
  }
}